

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

void __thiscall geometrycentral::surface::SurfaceMesh::compressHalfedges(SurfaceMesh *this)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  byte bVar1;
  _List_node_base *p_Var2;
  SurfaceMesh *this_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newIndMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newIndEdgeMap;
  size_t iEdge;
  vector<unsigned_long,_std::allocator<unsigned_long>_> oldIndMap;
  _func_int **local_a0;
  pointer local_88;
  _List_node_base *p_Stack_80;
  _List_node_base *local_78;
  _List_node_base *local_68;
  _List_node_base *p_Stack_60;
  pointer local_58;
  _List_node_base *local_50;
  _List_node_base *local_48;
  allocator_type *__a;
  
  local_78 = (_List_node_base *)0x0;
  local_58 = (pointer)0x0;
  local_88 = (pointer)0x0;
  p_Stack_80 = (_List_node_base *)0x0;
  local_68 = (_List_node_base *)0x0;
  p_Stack_60 = (_List_node_base *)0x0;
  __a = (allocator_type *)&stack0xffffffffffffff60;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8,
             this->nHalfedgesFillCount,&INVALID_IND,__a);
  this_00 = &this->heNextArr;
  for (local_a0 = (_func_int **)0x0; local_a0 < (_func_int **)this->nHalfedgesFillCount;
      local_a0 = (_func_int **)((long)local_a0 + 1)) {
    __a = (allocator_type *)
          (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start;
    if (*(long *)(__a + (long)local_a0 * 8) != -1) {
      p_Var2 = (_List_node_base *)((long)p_Stack_80 - (long)local_88 >> 3);
      (&local_48->_M_next)[(long)local_a0] = p_Var2;
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff78,
                 (value_type_conflict1 *)&stack0xffffffffffffff60);
      bVar1 = ((ulong)local_a0 & 1) == 0 & this->useImplicitTwinFlag;
      __a = (allocator_type *)CONCAT71((int7)((ulong)p_Var2 >> 8),bVar1);
      if (bVar1 == 1) {
        local_50 = (_List_node_base *)((ulong)local_a0 >> 1);
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff98
                   ,(value_type_conflict1 *)&stack0xffffffffffffffb0);
      }
    }
  }
  applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff60,
             (geometrycentral *)this_00,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff78,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (this_00,(_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &stack0xffffffffffffff60);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff60
            );
  applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff60,
             (geometrycentral *)&this->heVertexArr,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff78,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&this->heVertexArr,
             (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff60
            );
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff60
            );
  applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff60,
             (geometrycentral *)&this->heFaceArr,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff78,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
  this_01 = (SurfaceMesh *)&stack0xffffffffffffff60;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&this->heFaceArr,this_01);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
  if (this->useImplicitTwinFlag == false) {
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff60,
               (geometrycentral *)&this->heSiblingArr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff78,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&this->heSiblingArr,
               (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &stack0xffffffffffffff60);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &stack0xffffffffffffff60);
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff60,
               (geometrycentral *)&this->heEdgeArr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff78,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&this->heEdgeArr,
               (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &stack0xffffffffffffff60);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &stack0xffffffffffffff60);
    applyPermutation<char,std::allocator<char>,std::allocator<unsigned_long>>
              ((vector<char,_std::allocator<char>_> *)&stack0xffffffffffffff60,
               (geometrycentral *)&this->heOrientArr,
               (vector<char,_std::allocator<char>_> *)&stack0xffffffffffffff78,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
    ::std::vector<char,_std::allocator<char>_>::_M_move_assign
              (&this->heOrientArr,
               (_Vector_base<char,_std::allocator<char>_> *)&stack0xffffffffffffff60);
    ::std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&stack0xffffffffffffff60);
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff60,
               (geometrycentral *)&this->heVertInNextArr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff78,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&this->heVertInNextArr,
               (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &stack0xffffffffffffff60);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &stack0xffffffffffffff60);
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff60,
               (geometrycentral *)&this->heVertInPrevArr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff78,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&this->heVertInPrevArr,
               (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &stack0xffffffffffffff60);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &stack0xffffffffffffff60);
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff60,
               (geometrycentral *)&this->heVertOutNextArr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff78,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&this->heVertOutNextArr,
               (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &stack0xffffffffffffff60);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &stack0xffffffffffffff60);
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff60,
               (geometrycentral *)&this->heVertOutPrevArr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff78,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
    this_01 = (SurfaceMesh *)&stack0xffffffffffffff60;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&this->heVertOutPrevArr,this_01);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
  }
  updateValues(this_01,&this->vHalfedgeArr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8);
  updateValues(this_01,&this->fHalfedgeArr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8);
  updateValues(this_01,this_00,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8);
  if (this->useImplicitTwinFlag == false) {
    updateValues(this_01,&this->eHalfedgeArr,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8);
    updateValues(this_01,&this->heSiblingArr,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8);
    updateValues(this_01,&this->heVertInNextArr,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8);
    updateValues(this_01,&this->heVertInPrevArr,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8);
    updateValues(this_01,&this->vHeInStartArr,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8);
    updateValues(this_01,&this->heVertOutNextArr,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8);
    updateValues(this_01,&this->heVertOutPrevArr,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8);
    updateValues(this_01,&this->vHeOutStartArr,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8);
  }
  this->nHalfedgesFillCount = this->nHalfedgesCount;
  this->nHalfedgesCapacityCount = this->nHalfedgesCount;
  p_Var2 = (_List_node_base *)&this->halfedgePermuteCallbackList;
  while (p_Var2 = (((_List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->halfedgePermuteCallbackList) {
    ::std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>::
    operator()((function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>
                *)(p_Var2 + 1),
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff78);
  }
  if (this->useImplicitTwinFlag != false) {
    this->nEdgesFillCount = this->nEdgesCount;
    this->nEdgesCapacityCount = this->nEdgesCount;
    p_Var2 = (_List_node_base *)&this->edgePermuteCallbackList;
    while (p_Var2 = (((_List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
                       *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var2 != (_List_node_base *)&this->edgePermuteCallbackList) {
      ::std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>::
      operator()((function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>
                  *)(p_Var2 + 1),
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff98);
    }
  }
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb8
            );
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff98
            );
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff78
            );
  return;
}

Assistant:

void SurfaceMesh::compressHalfedges() {

  // Build the compressing shift
  std::vector<size_t> newIndMap;                                   // maps new ind -> old ind
  std::vector<size_t> newIndEdgeMap;                               // maps edge new ind -> old ind
  std::vector<size_t> oldIndMap(nHalfedgesFillCount, INVALID_IND); // maps old ind -> new ind
  for (size_t i = 0; i < nHalfedgesFillCount; i++) {
    if (!halfedgeIsDead(i)) {
      oldIndMap[i] = newIndMap.size();
      newIndMap.push_back(i);

      if (usesImplicitTwin() && i % 2 == 0) {
        size_t iEdge = i / 2;
        newIndEdgeMap.push_back(iEdge);
      }
    }
  }

  // Permute & resize all per-halfedge arrays
  heNextArr = applyPermutation(heNextArr, newIndMap);
  heVertexArr = applyPermutation(heVertexArr, newIndMap);
  heFaceArr = applyPermutation(heFaceArr, newIndMap);
  if (!usesImplicitTwin()) {
    heSiblingArr = applyPermutation(heSiblingArr, newIndMap);
    heEdgeArr = applyPermutation(heEdgeArr, newIndMap);
    heOrientArr = applyPermutation(heOrientArr, newIndMap);
    heVertInNextArr = applyPermutation(heVertInNextArr, newIndMap);
    heVertInPrevArr = applyPermutation(heVertInPrevArr, newIndMap);
    heVertOutNextArr = applyPermutation(heVertOutNextArr, newIndMap);
    heVertOutPrevArr = applyPermutation(heVertOutPrevArr, newIndMap);
  }


  // Update indices in all halfedge-valued arrays
  updateValues(vHalfedgeArr, oldIndMap);
  updateValues(fHalfedgeArr, oldIndMap);
  updateValues(heNextArr, oldIndMap);
  if (!usesImplicitTwin()) {
    updateValues(eHalfedgeArr, oldIndMap);
    updateValues(heSiblingArr, oldIndMap);
    updateValues(heVertInNextArr, oldIndMap);
    updateValues(heVertInPrevArr, oldIndMap);
    updateValues(vHeInStartArr, oldIndMap);
    updateValues(heVertOutNextArr, oldIndMap);
    updateValues(heVertOutPrevArr, oldIndMap);
    updateValues(vHeOutStartArr, oldIndMap);
  }

  // Update counts
  nHalfedgesFillCount = nHalfedgesCount;
  nHalfedgesCapacityCount = nHalfedgesCount;

  // Invoke callbacks
  for (auto& f : halfedgePermuteCallbackList) {
    f(newIndMap);
  }

  // In the implicit-twin case, we also need to update edge data here, because they are always in-sync with halfedges
  if (usesImplicitTwin()) {
    nEdgesFillCount = nEdgesCount;
    nEdgesCapacityCount = nEdgesCount;
    // Invoke callbacks
    for (auto& f : edgePermuteCallbackList) {
      f(newIndEdgeMap);
    }
  }
}